

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::CleanConstraintGraph(cmComputeLinkDepends *this)

{
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  bool bVar1;
  __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_> local_70
  ;
  const_iterator local_68;
  cmGraphEdge *local_60;
  __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_> local_58
  ;
  __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_> local_50
  ;
  const_iterator local_48;
  cmGraphEdge *local_40;
  __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_> local_38
  ;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *local_30;
  cmGraphEdgeList *edgeList;
  iterator __end1;
  iterator __begin1;
  Graph *__range1;
  cmComputeLinkDepends *this_local;
  
  __end1 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::begin
                     (&(this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  edgeList = (cmGraphEdgeList *)
             std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::end
                       (&(this->EntryConstraintGraph).
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGraphEdgeList_*,_std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>_>
                                *)&edgeList);
    if (!bVar1) break;
    local_30 = &__gnu_cxx::
                __normal_iterator<cmGraphEdgeList_*,_std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>_>
                ::operator*(&__end1)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    local_38._M_current =
         (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(local_30);
    local_40 = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(local_30);
    std::
    sort<__gnu_cxx::__normal_iterator<cmGraphEdge*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>>
              (local_38,(__normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                         )local_40);
    this_00 = local_30;
    local_58._M_current =
         (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(local_30);
    local_60 = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(local_30);
    local_50 = std::
               unique<__gnu_cxx::__normal_iterator<cmGraphEdge*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>>
                         (local_58,(__normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                    )local_60);
    __gnu_cxx::
    __normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>::
    __normal_iterator<cmGraphEdge*>
              ((__normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>
                *)&local_48,&local_50);
    local_70._M_current =
         (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(local_30);
    __gnu_cxx::
    __normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>::
    __normal_iterator<cmGraphEdge*>
              ((__normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>
                *)&local_68,&local_70);
    std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::erase(this_00,local_48,local_68);
    __gnu_cxx::
    __normal_iterator<cmGraphEdgeList_*,_std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::CleanConstraintGraph()
{
  for (cmGraphEdgeList& edgeList : this->EntryConstraintGraph) {
    // Sort the outgoing edges for each graph node so that the
    // original order will be preserved as much as possible.
    std::sort(edgeList.begin(), edgeList.end());

    // Make the edge list unique.
    edgeList.erase(std::unique(edgeList.begin(), edgeList.end()),
                   edgeList.end());
  }
}